

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

TrieNode<unsigned_char> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,vector_bagwell<unsigned_char_*,_16U> *bucket,
          size_t depth)

{
  byte bVar1;
  pointer pppuVar2;
  TrieNode<unsigned_char> *__s;
  uchar *puVar3;
  vector_bagwell<unsigned_char_*,_16U> *pvVar4;
  ulong uVar5;
  uint j_1;
  uint j;
  long lVar6;
  uchar **t;
  size_t index;
  ulong uVar7;
  array<unsigned_char,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  byte abStack_270 [64];
  uchar *local_230 [64];
  
  __s = (TrieNode<unsigned_char> *)operator_new(0x820);
  uVar7 = 0;
  memset(__s,0,0x820);
  uVar5 = 0;
  if (bucket->_insertpos != (uchar **)0x0) {
    pppuVar2 = (bucket->_index_block).
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar5 = (long)bucket->_insertpos +
            ((ulong)((1 << ((char)((uint)((int)pppuVar2 -
                                         *(int *)&(bucket->_index_block).
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                            3U & 0x1f)) - 0x10) * 8 - (long)pppuVar2[-1]) >> 3;
  }
  if ((uVar5 & 0xffffffc0) != 0) {
    uVar7 = 0;
    do {
      lVar6 = 0;
      do {
        puVar3 = vector_bagwell<unsigned_char_*,_16U>::operator[](bucket,lVar6 + uVar7);
        local_230[lVar6] = puVar3;
        if (puVar3 == (uchar *)0x0) goto LAB_0020d2dd;
        abStack_270[lVar6] = puVar3[depth];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x40);
      t = local_230;
      lVar6 = 0;
      do {
        bVar1 = abStack_270[lVar6];
        pvVar4 = (vector_bagwell<unsigned_char_*,_16U> *)(__s->buckets)._M_elems[bVar1];
        if (pvVar4 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
          pvVar4 = (vector_bagwell<unsigned_char_*,_16U> *)operator_new(0x28);
          (pvVar4->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar4->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar4->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar4->_insertpos = (uchar **)0x0;
          pvVar4->_left_in_block = 0;
          (__s->buckets)._M_elems[bVar1] = pvVar4;
        }
        vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar4,t);
        lVar6 = lVar6 + 1;
        t = t + 1;
      } while (lVar6 != 0x40);
      uVar7 = uVar7 + 0x40;
    } while (uVar7 < ((uint)uVar5 & 0xffffffc0));
  }
  if ((uint)uVar7 < (uint)uVar5) {
    index = uVar7 & 0xffffffff;
    do {
      local_230[0] = vector_bagwell<unsigned_char_*,_16U>::operator[](bucket,index);
      if (local_230[0] == (uchar *)0x0) {
LAB_0020d2dd:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar1 = local_230[0][depth];
      pvVar4 = (vector_bagwell<unsigned_char_*,_16U> *)(__s->buckets)._M_elems[bVar1];
      if (pvVar4 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
        pvVar4 = (vector_bagwell<unsigned_char_*,_16U> *)operator_new(0x28);
        (pvVar4->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar4->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar4->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar4->_insertpos = (uchar **)0x0;
        pvVar4->_left_in_block = 0;
        (__s->buckets)._M_elems[bVar1] = pvVar4;
      }
      vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar4,local_230);
      index = index + 1;
    } while ((uVar5 & 0xffffffff) != index);
  }
  return __s;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}